

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall clipp::detail::match_t::match_t(match_t *this,match_t *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pcVar5;
  context_list *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  
  paVar1 = &(this->str_).field_2;
  paVar2 = &(param_1->str_).field_2;
  (this->str_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->str_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->str_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->str_).field_2 + 8) = uVar4;
  }
  else {
    (this->str_)._M_dataplus._M_p = pcVar3;
    (this->str_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->str_)._M_string_length = (param_1->str_)._M_string_length;
  (param_1->str_)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->str_)._M_string_length = 0;
  (param_1->str_).field_2._M_local_buf[0] = '\0';
  pcVar5 = (param_1->pos_).pos_.stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->pos_).pos_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->pos_).pos_.stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->pos_).pos_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = pcVar5;
  auVar10 = ZEXT816(0) << 0x20;
  (this->pos_).pos_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->pos_).pos_.stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->pos_).pos_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar6 = &(param_1->pos_).pos_.stack_;
  (pcVar6->
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)auVar10._0_8_;
  (pcVar6->
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar10._8_8_;
  pcVar5 = (param_1->pos_).lastMatch_.stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->pos_).lastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->pos_).lastMatch_.stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->pos_).lastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = pcVar5;
  (this->pos_).lastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->pos_).lastMatch_.stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->pos_).lastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar6 = &(param_1->pos_).lastMatch_.stack_;
  (pcVar6->
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)auVar10._0_8_;
  (pcVar6->
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar10._8_8_;
  pcVar5 = (param_1->pos_).posAfterLastMatch_.stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->pos_).posAfterLastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->pos_).posAfterLastMatch_.stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->pos_).posAfterLastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = pcVar5;
  (this->pos_).posAfterLastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->pos_).posAfterLastMatch_.stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->pos_).posAfterLastMatch_.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar6 = &(param_1->pos_).posAfterLastMatch_.stack_;
  (pcVar6->
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)auVar10._0_8_;
  (pcVar6->
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar10._8_8_;
  std::
  _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ::_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 *)&(this->pos_).scopes_,
                (_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 *)&(param_1->pos_).scopes_);
  bVar7 = (param_1->pos_).ignoreBlocks_;
  bVar8 = (param_1->pos_).repeatGroupStarted_;
  bVar9 = (param_1->pos_).repeatGroupContinues_;
  (this->pos_).curMatched_ = (param_1->pos_).curMatched_;
  (this->pos_).ignoreBlocks_ = bVar7;
  (this->pos_).repeatGroupStarted_ = bVar8;
  (this->pos_).repeatGroupContinues_ = bVar9;
  return;
}

Assistant:

match_t(arg_string s, scoped_dfs_traverser p):
        str_{std::move(s)}, pos_{std::move(p)}
    {}